

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O1

size_t __thiscall
unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
get_current_memory_use
          (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this)

{
  size_t sVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar2 == 0) {
    sVar1 = (this->db_).current_memory_use;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return sVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

[[nodiscard]] auto get_current_memory_use() const {
    const std::lock_guard guard{mutex};
    return db_.get_current_memory_use();
  }